

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashUtils.hpp
# Opt level: O1

void __thiscall
Diligent::HashMapStringKey::HashMapStringKey(HashMapStringKey *this,Char *_Str,bool bMakeCopy)

{
  char *__s;
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  Char *__dest;
  char *pcVar6;
  string msg;
  string local_50;
  
  this->Str = _Str;
  this->Ownership_Hash = 0;
  if (_Str == (Char *)0x0) {
    FormatString<char[32]>(&local_50,(char (*) [32])"String pointer must not be null");
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"HashMapStringKey",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/HashUtils.hpp"
               ,0xec);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  __s = this->Str;
  pcVar4 = __s;
  pcVar3 = (char *)0x0;
  pcVar2 = (char *)0x0;
  pcVar6 = __s;
  while (pcVar1 = pcVar3, pcVar6 != (char *)0x0) {
    pcVar6 = (char *)(long)*pcVar4;
    pcVar4 = pcVar4 + 1;
    pcVar3 = pcVar6 + (long)pcVar1 * 0x1003f;
    pcVar2 = pcVar1;
  }
  this->Ownership_Hash = (ulong)pcVar2 & 0x7fffffffffffffff;
  if (bMakeCopy) {
    sVar5 = strlen(__s);
    __dest = (Char *)operator_new__(sVar5 + 1);
    memcpy(__dest,__s,sVar5 + 1);
    this->Str = __dest;
    this->Ownership_Hash = (ulong)pcVar2 | 0x8000000000000000;
  }
  return;
}

Assistant:

HashMapStringKey(const Char* _Str, bool bMakeCopy = false) :
        Str{_Str}
    {
        VERIFY(Str, "String pointer must not be null");

        Ownership_Hash = CStringHash<Char>{}.operator()(Str) & HashMask;
        if (bMakeCopy)
        {
            auto  LenWithZeroTerm = strlen(Str) + 1;
            auto* StrCopy         = new char[LenWithZeroTerm];
            std::memcpy(StrCopy, Str, LenWithZeroTerm);
            Str = StrCopy;
            Ownership_Hash |= StrOwnershipMask;
        }
    }